

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar34 [32];
  undefined1 auVar33 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar59 [16];
  float fVar57;
  undefined4 uVar58;
  undefined1 in_register_00001204 [60];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vfloat4 b0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vfloat4 a0;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  vfloat4 b1;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar77;
  float fVar78;
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 in_ZMM21 [64];
  
  auVar60._4_60_ = in_register_00001204;
  auVar60._0_4_ = scale;
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar12 = sVar7 * uVar4;
  lVar13 = sVar7 * (uVar4 + 1);
  lVar10 = sVar7 * (uVar4 + 2);
  lVar11 = sVar7 * (uVar4 + 3);
  fVar57 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar9 = pBVar8[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar8[itime].super_RawBufferView.stride;
  auVar32 = *(undefined1 (*) [16])(pcVar9 + uVar4 * sVar7);
  auVar36._16_16_ = in_YmmResult._16_16_;
  auVar29 = *(undefined1 (*) [16])(pcVar9 + (uVar4 + 1) * sVar7);
  auVar33 = *(undefined1 (*) [16])(pcVar9 + (uVar4 + 2) * sVar7);
  auVar28 = *(undefined1 (*) [16])(pcVar9 + sVar7 * (uVar4 + 3));
  aVar1 = ofs->field_0;
  aVar2 = (space->vy).field_0;
  auVar63 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar14 = vbroadcastss_avx512vl(auVar60._0_16_);
  auVar26 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar12),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar12 + 0xc))),0x30);
  auVar27 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar13),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar13 + 0xc))),0x30);
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar10),
                          ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar10 + 0xc))),0x30);
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar31 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar6 + lVar11),
                              ZEXT416((uint)(fVar57 * *(float *)(pcVar6 + lVar11 + 0xc))),0x30);
  auVar15 = vmulps_avx512vl(auVar31,auVar87);
  auVar36._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar16 = vfmadd213ps_avx512vl(ZEXT816(0),auVar30,auVar15);
  auVar59._0_4_ = auVar27._0_4_ + auVar16._0_4_;
  auVar59._4_4_ = auVar27._4_4_ + auVar16._4_4_;
  auVar59._8_4_ = auVar27._8_4_ + auVar16._8_4_;
  auVar59._12_4_ = auVar27._12_4_ + auVar16._12_4_;
  auVar62 = vfmadd231ps_fma(auVar59,auVar26,auVar87);
  auVar59 = vshufps_avx(auVar62,auVar62,0xff);
  auVar17 = vmulps_avx512vl(auVar28,auVar87);
  auVar16 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar33,auVar17);
  auVar16 = vaddps_avx512vl(auVar29,auVar16);
  auVar18 = vfmadd231ps_avx512vl(auVar16,auVar32,auVar87);
  auVar16 = vmulps_avx512vl(auVar31,auVar36._0_16_);
  auVar66._8_4_ = 0x3f000000;
  auVar66._0_8_ = 0x3f0000003f000000;
  auVar66._12_4_ = 0x3f000000;
  auVar16 = vfmadd231ps_fma(auVar16,auVar30,auVar66);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar27,auVar36._0_16_);
  auVar64 = vfnmadd231ps_fma(auVar16,auVar26,auVar66);
  auVar24 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar16 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar73._0_4_ = auVar64._0_4_ * auVar16._0_4_;
  auVar73._4_4_ = auVar64._4_4_ * auVar16._4_4_;
  auVar73._8_4_ = auVar64._8_4_ * auVar16._8_4_;
  auVar73._12_4_ = auVar64._12_4_ * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar73,auVar24,auVar18);
  auVar18 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar57 = auVar16._0_4_;
  auVar34._4_28_ = auVar36._4_28_;
  auVar34._0_4_ = fVar57;
  auVar19 = vrsqrt14ss_avx512f(auVar36._0_16_,auVar34._0_16_);
  auVar20 = vmulss_avx512f(auVar19,ZEXT416(0x3fc00000));
  auVar21 = vmulss_avx512f(auVar16,ZEXT416(0xbf000000));
  auVar21 = vmulss_avx512f(auVar21,auVar19);
  auVar19 = vmulss_avx512f(auVar21,ZEXT416((uint)(auVar19._0_4_ * auVar19._0_4_)));
  auVar19 = vaddss_avx512f(auVar20,auVar19);
  auVar19 = vbroadcastss_avx512vl(auVar19);
  auVar20 = vmulps_avx512vl(auVar18,auVar19);
  auVar21 = vmulps_avx512vl(auVar59,auVar20);
  auVar76._0_4_ = auVar62._0_4_ + auVar21._0_4_;
  auVar76._4_4_ = auVar62._4_4_ + auVar21._4_4_;
  auVar76._8_4_ = auVar62._8_4_ + auVar21._8_4_;
  auVar76._12_4_ = auVar62._12_4_ + auVar21._12_4_;
  auVar22 = vmulps_avx512vl(auVar28,auVar36._0_16_);
  auVar22 = vfmadd231ps_avx512vl(auVar22,auVar33,auVar66);
  auVar22 = vfmadd231ps_avx512vl(auVar22,auVar29,auVar36._0_16_);
  auVar22 = vfnmadd231ps_avx512vl(auVar22,auVar32,auVar66);
  auVar23 = vshufps_avx512vl(auVar22,auVar22,0xc9);
  auVar23 = vmulps_avx512vl(auVar64,auVar23);
  auVar24 = vfmsub231ps_avx512vl(auVar23,auVar24,auVar22);
  auVar22 = vsubps_avx512vl(auVar76,(undefined1  [16])aVar1);
  auVar22 = vmulps_avx512vl(auVar14,auVar22);
  auVar23 = vshufps_avx512vl(auVar22,auVar22,0xaa);
  auVar23 = vmulps_avx512vl(auVar63,auVar23);
  auVar25 = vshufps_avx512vl(auVar22,auVar22,0x55);
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar2,auVar25);
  auVar22 = vbroadcastss_avx512vl(auVar22);
  aVar3 = (space->vx).field_0;
  auVar22 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar22);
  auVar23 = vrcp14ss_avx512f(auVar36._0_16_,auVar34._0_16_);
  auVar16 = vfnmadd213ss_avx512f(auVar16,auVar23,ZEXT416(0x40000000));
  auVar23 = vmulss_avx512f(auVar23,auVar16);
  auVar24 = vshufps_avx512vl(auVar24,auVar24,0xc9);
  auVar16 = vdpps_avx(auVar18,auVar24,0x7f);
  auVar25 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar20 = vmulps_avx512vl(auVar25,auVar20);
  auVar61._0_4_ = auVar24._0_4_ * fVar57;
  auVar61._4_4_ = auVar24._4_4_ * fVar57;
  auVar61._8_4_ = auVar24._8_4_ * fVar57;
  auVar61._12_4_ = auVar24._12_4_ * fVar57;
  fVar57 = auVar16._0_4_;
  auVar24._0_4_ = auVar18._0_4_ * fVar57;
  auVar24._4_4_ = auVar18._4_4_ * fVar57;
  auVar24._8_4_ = auVar18._8_4_ * fVar57;
  auVar24._12_4_ = auVar18._12_4_ * fVar57;
  auVar16 = vsubps_avx(auVar61,auVar24);
  auVar24 = vbroadcastss_avx512vl(auVar23);
  auVar18._0_4_ = auVar24._0_4_ * auVar16._0_4_;
  auVar18._4_4_ = auVar24._4_4_ * auVar16._4_4_;
  auVar18._8_4_ = auVar24._8_4_ * auVar16._8_4_;
  auVar18._12_4_ = auVar24._12_4_ * auVar16._12_4_;
  auVar16 = vmulps_avx512vl(auVar19,auVar18);
  auVar19._0_4_ = auVar59._0_4_ * auVar16._0_4_;
  auVar19._4_4_ = auVar59._4_4_ * auVar16._4_4_;
  auVar19._8_4_ = auVar59._8_4_ * auVar16._8_4_;
  auVar19._12_4_ = auVar59._12_4_ * auVar16._12_4_;
  auVar24 = vaddps_avx512vl(auVar20,auVar19);
  auVar20._0_4_ = auVar64._0_4_ + auVar24._0_4_;
  auVar20._4_4_ = auVar64._4_4_ + auVar24._4_4_;
  auVar20._8_4_ = auVar64._8_4_ + auVar24._8_4_;
  auVar20._12_4_ = auVar64._12_4_ + auVar24._12_4_;
  auVar16._8_4_ = 0x3eaaaaab;
  auVar16._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar16._12_4_ = 0x3eaaaaab;
  auVar16 = vmulps_avx512vl(auVar20,auVar16);
  auVar23._0_4_ = auVar76._0_4_ + auVar16._0_4_;
  auVar23._4_4_ = auVar76._4_4_ + auVar16._4_4_;
  auVar23._8_4_ = auVar76._8_4_ + auVar16._8_4_;
  auVar23._12_4_ = auVar76._12_4_ + auVar16._12_4_;
  auVar16 = vsubps_avx(auVar23,(undefined1  [16])aVar1);
  auVar18 = vmulps_avx512vl(auVar14,auVar16);
  auVar16 = vshufps_avx(auVar18,auVar18,0x55);
  auVar59 = vshufps_avx(auVar18,auVar18,0xaa);
  fVar83 = auVar63._0_4_;
  auVar69._0_4_ = fVar83 * auVar59._0_4_;
  fVar84 = auVar63._4_4_;
  auVar69._4_4_ = fVar84 * auVar59._4_4_;
  fVar85 = auVar63._8_4_;
  auVar69._8_4_ = fVar85 * auVar59._8_4_;
  fVar86 = auVar63._12_4_;
  auVar69._12_4_ = fVar86 * auVar59._12_4_;
  auVar16 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar16);
  auVar25._0_4_ = auVar18._0_4_;
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = auVar25._0_4_;
  auVar25._12_4_ = auVar25._0_4_;
  auVar59 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar25);
  auVar16 = vaddps_avx512vl(auVar30,auVar15);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar27,auVar36._0_16_);
  auVar18 = vfmadd231ps_avx512vl(auVar16,auVar26,auVar87);
  auVar16 = vaddps_avx512vl(auVar33,auVar17);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar29,auVar36._0_16_);
  auVar15 = vfmadd231ps_avx512vl(auVar16,auVar32,auVar87);
  auVar16 = vmulps_avx512vl(auVar31,auVar66);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar36._0_16_,auVar30);
  auVar16 = vfnmadd231ps_avx512vl(auVar16,auVar66,auVar27);
  auVar26 = vfmadd231ps_avx512vl(auVar16,auVar36._0_16_,auVar26);
  auVar27 = vshufps_avx512vl(auVar26,auVar26,0xc9);
  auVar16 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar16 = vmulps_avx512vl(auVar26,auVar16);
  auVar16 = vfmsub231ps_fma(auVar16,auVar27,auVar15);
  auVar16 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar43._16_16_ = bezier_basis0._7428_16_;
  auVar28 = vmulps_avx512vl(auVar28,auVar66);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar36._0_16_,auVar33);
  auVar33 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar29 = vfnmadd231ps_avx512vl(auVar28,auVar29,auVar66);
  fVar57 = auVar33._0_4_;
  auVar43._0_16_ = auVar36._0_16_;
  auVar42._4_28_ = auVar43._4_28_;
  auVar42._0_4_ = fVar57;
  auVar28 = vrsqrt14ss_avx512f(auVar36._0_16_,auVar42._0_16_);
  auVar30 = vmulss_avx512f(auVar28,ZEXT416(0x3fc00000));
  auVar31 = vmulss_avx512f(auVar33,ZEXT416(0xbf000000));
  auVar31 = vmulss_avx512f(auVar31,auVar28);
  auVar28 = vmulss_avx512f(auVar31,ZEXT416((uint)(auVar28._0_4_ * auVar28._0_4_)));
  auVar41._8_4_ = 2;
  auVar41._0_8_ = 0x200000002;
  auVar41._12_4_ = 2;
  auVar41._16_4_ = 2;
  auVar41._20_4_ = 2;
  auVar41._24_4_ = 2;
  auVar41._28_4_ = 2;
  auVar28 = vaddss_avx512f(auVar30,auVar28);
  auVar32 = vfmadd231ps_avx512vl(auVar29,auVar36._0_16_,auVar32);
  auVar29 = vshufps_avx512vl(auVar32,auVar32,0xc9);
  auVar29 = vmulps_avx512vl(auVar26,auVar29);
  auVar32 = vfmsub231ps_avx512vl(auVar29,auVar27,auVar32);
  auVar32 = vshufps_avx512vl(auVar32,auVar32,0xc9);
  auVar29._0_4_ = fVar57 * auVar32._0_4_;
  auVar29._4_4_ = fVar57 * auVar32._4_4_;
  auVar29._8_4_ = fVar57 * auVar32._8_4_;
  auVar29._12_4_ = fVar57 * auVar32._12_4_;
  auVar32 = vdpps_avx(auVar16,auVar32,0x7f);
  auVar34 = vpermps_avx512vl(auVar41,ZEXT1632(auVar22));
  fVar57 = auVar32._0_4_;
  auVar17._0_4_ = fVar57 * auVar16._0_4_;
  auVar17._4_4_ = fVar57 * auVar16._4_4_;
  auVar17._8_4_ = fVar57 * auVar16._8_4_;
  auVar17._12_4_ = fVar57 * auVar16._12_4_;
  auVar32 = vsubps_avx(auVar29,auVar17);
  auVar40 = vpermps_avx2(auVar41,ZEXT1632(auVar59));
  auVar29 = vrcp14ss_avx512f(auVar36._0_16_,auVar42._0_16_);
  auVar27 = vshufps_avx512vl(auVar18,auVar18,0xff);
  fVar77 = auVar28._0_4_;
  auVar31._0_4_ = fVar77 * auVar16._0_4_;
  auVar31._4_4_ = fVar77 * auVar16._4_4_;
  auVar31._8_4_ = fVar77 * auVar16._8_4_;
  auVar31._12_4_ = fVar77 * auVar16._12_4_;
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar29,ZEXT416(0x40000000));
  auVar28 = vshufps_avx512vl(auVar26,auVar26,0xff);
  auVar28 = vmulps_avx512vl(auVar28,auVar31);
  auVar16 = vmulps_avx512vl(auVar27,auVar31);
  fVar57 = auVar33._0_4_ * auVar29._0_4_;
  auVar33 = vaddps_avx512vl(auVar18,auVar16);
  auVar30._0_4_ = fVar77 * auVar32._0_4_ * fVar57;
  auVar30._4_4_ = fVar77 * auVar32._4_4_ * fVar57;
  auVar30._8_4_ = fVar77 * auVar32._8_4_ * fVar57;
  auVar30._12_4_ = fVar77 * auVar32._12_4_ * fVar57;
  auVar32 = vmulps_avx512vl(auVar27,auVar30);
  auVar28 = vaddps_avx512vl(auVar28,auVar32);
  auVar29 = vaddps_avx512vl(auVar26,auVar28);
  auVar32._8_4_ = 0x3eaaaaab;
  auVar32._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar32._12_4_ = 0x3eaaaaab;
  auVar32 = vmulps_avx512vl(auVar29,auVar32);
  auVar32 = vsubps_avx(auVar33,auVar32);
  auVar32 = vsubps_avx512vl(auVar32,(undefined1  [16])aVar1);
  auVar29 = vmulps_avx512vl(auVar14,auVar32);
  uVar58 = auVar29._0_4_;
  auVar15._4_4_ = uVar58;
  auVar15._0_4_ = uVar58;
  auVar15._8_4_ = uVar58;
  auVar15._12_4_ = uVar58;
  auVar32 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar27._0_4_ = fVar83 * auVar29._0_4_;
  auVar27._4_4_ = fVar84 * auVar29._4_4_;
  auVar27._8_4_ = fVar85 * auVar29._8_4_;
  auVar27._12_4_ = fVar86 * auVar29._12_4_;
  auVar32 = vfmadd231ps_fma(auVar27,(undefined1  [16])aVar2,auVar32);
  auVar29 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar15);
  auVar38 = vpermps_avx2(auVar41,ZEXT1632(auVar29));
  auVar32 = vsubps_avx512vl(auVar33,(undefined1  [16])aVar1);
  auVar32 = vmulps_avx512vl(auVar14,auVar32);
  uVar58 = auVar32._0_4_;
  auVar65._4_4_ = uVar58;
  auVar65._0_4_ = uVar58;
  auVar65._8_4_ = uVar58;
  auVar65._12_4_ = uVar58;
  auVar33 = vshufps_avx512vl(auVar32,auVar32,0x55);
  auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
  auVar32 = vmulps_avx512vl(auVar63,auVar32);
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar2,auVar33);
  auVar32 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar65);
  auVar37 = vpermps_avx2(auVar41,ZEXT1632(auVar32));
  auVar35 = vmulps_avx512vl(auVar37,bezier_basis0._3944_32_);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar38);
  auVar53._8_8_ = bezier_basis0._1640_8_;
  auVar53._0_8_ = bezier_basis0._1632_8_;
  auVar53._16_8_ = bezier_basis0._1648_8_;
  auVar53._24_8_ = bezier_basis0._1656_8_;
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar53,auVar40);
  auVar35._8_8_ = bezier_basis0._484_8_;
  auVar35._0_8_ = bezier_basis0._476_8_;
  auVar35._16_8_ = bezier_basis0._492_8_;
  auVar35._24_8_ = bezier_basis0._500_8_;
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar35,auVar34);
  auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._8568_32_);
  auVar38 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar38);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._6256_32_,auVar40);
  auVar37 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._5100_32_,auVar34);
  auVar44._8_4_ = 0x3d638e39;
  auVar44._0_8_ = 0x3d638e393d638e39;
  auVar44._12_4_ = 0x3d638e39;
  auVar44._16_4_ = 0x3d638e39;
  auVar44._20_4_ = 0x3d638e39;
  auVar44._24_4_ = 0x3d638e39;
  auVar44._28_4_ = 0x3d638e39;
  auVar38._4_4_ = auVar37._4_4_ * 0.055555556;
  auVar38._0_4_ = auVar37._0_4_ * 0.055555556;
  auVar38._8_4_ = auVar37._8_4_ * 0.055555556;
  auVar38._12_4_ = auVar37._12_4_ * 0.055555556;
  auVar38._16_4_ = auVar37._16_4_ * 0.055555556;
  auVar38._20_4_ = auVar37._20_4_ * 0.055555556;
  auVar38._24_4_ = auVar37._24_4_ * 0.055555556;
  auVar38._28_4_ = auVar40._28_4_;
  auVar37 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar40 = vblendps_avx(auVar38,auVar37,1);
  auVar34 = vsubps_avx512vl(auVar36,auVar40);
  auVar40 = vblendps_avx(auVar38,auVar37,0x80);
  auVar39 = vaddps_avx512vl(auVar36,auVar40);
  auVar67._8_4_ = 0xff800000;
  auVar67._0_8_ = 0xff800000ff800000;
  auVar67._12_4_ = 0xff800000;
  auVar67._16_4_ = 0xff800000;
  auVar67._20_4_ = 0xff800000;
  auVar67._24_4_ = 0xff800000;
  auVar67._28_4_ = 0xff800000;
  auVar40 = vmaxps_avx512vl(auVar67,auVar36);
  auVar38 = vmaxps_avx512vl(auVar34,auVar39);
  auVar41 = vmaxps_avx512vl(auVar40,auVar38);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar40 = vpermps_avx512vl(auVar42,ZEXT1632(auVar29));
  auVar38 = vpermps_avx512vl(auVar42,ZEXT1632(auVar32));
  auVar37 = vmulps_avx512vl(auVar38,bezier_basis0._3944_32_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2788_32_,auVar40);
  auVar38 = vmulps_avx512vl(auVar38,bezier_basis0._8568_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._7412_32_,auVar40);
  auVar38 = vpermps_avx512vl(auVar42,ZEXT1632(auVar59));
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar53,auVar38);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._6256_32_,auVar38);
  auVar38 = vpermps_avx512vl(auVar42,ZEXT1632(auVar22));
  auVar43 = vfmadd231ps_avx512vl(auVar37,auVar35,auVar38);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._5100_32_,auVar38);
  auVar38 = vmulps_avx512vl(auVar40,auVar44);
  auVar37 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar40 = vblendps_avx(auVar38,auVar37,1);
  auVar44 = vsubps_avx512vl(auVar43,auVar40);
  auVar40 = vblendps_avx(auVar38,auVar37,0x80);
  auVar45 = vaddps_avx512vl(auVar43,auVar40);
  auVar40 = vmaxps_avx512vl(auVar67,auVar43);
  auVar38 = vmaxps_avx512vl(auVar44,auVar45);
  auVar38 = vmaxps_avx(auVar40,auVar38);
  uVar58 = auVar29._0_4_;
  auVar50._4_4_ = uVar58;
  auVar50._0_4_ = uVar58;
  auVar50._8_4_ = uVar58;
  auVar50._12_4_ = uVar58;
  auVar50._16_4_ = uVar58;
  auVar50._20_4_ = uVar58;
  auVar50._24_4_ = uVar58;
  auVar50._28_4_ = uVar58;
  auVar47._0_4_ = auVar32._0_4_;
  auVar47._4_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar47._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  auVar47._16_4_ = auVar47._0_4_;
  auVar47._20_4_ = auVar47._0_4_;
  auVar47._24_4_ = auVar47._0_4_;
  auVar47._28_4_ = auVar47._0_4_;
  fVar57 = bezier_basis0._3944_4_;
  auVar46._0_4_ = fVar57 * auVar47._0_4_;
  fVar77 = bezier_basis0._3948_4_;
  auVar46._4_4_ = fVar77 * auVar47._0_4_;
  fVar78 = bezier_basis0._3952_4_;
  auVar46._8_4_ = fVar78 * auVar47._0_4_;
  fVar79 = bezier_basis0._3956_4_;
  auVar46._12_4_ = fVar79 * auVar47._0_4_;
  fVar80 = bezier_basis0._3960_4_;
  auVar46._16_4_ = fVar80 * auVar47._0_4_;
  fVar81 = bezier_basis0._3964_4_;
  auVar46._20_4_ = fVar81 * auVar47._0_4_;
  fVar82 = bezier_basis0._3968_4_;
  auVar46._24_4_ = fVar82 * auVar47._0_4_;
  auVar46._28_4_ = 0;
  auVar40 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._2788_32_,auVar50);
  auVar37 = vmulps_avx512vl(auVar47,bezier_basis0._8568_32_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar50);
  uVar58 = auVar59._0_4_;
  auVar48._4_4_ = uVar58;
  auVar48._0_4_ = uVar58;
  auVar48._8_4_ = uVar58;
  auVar48._12_4_ = uVar58;
  auVar48._16_4_ = uVar58;
  auVar48._20_4_ = uVar58;
  auVar48._24_4_ = uVar58;
  auVar48._28_4_ = uVar58;
  auVar32 = vfmadd231ps_fma(auVar40,auVar53,auVar48);
  auVar40 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._6256_32_,auVar48);
  auVar37 = vbroadcastss_avx512vl(auVar22);
  auVar46 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar35,auVar37);
  auVar63 = vfmadd231ps_fma(auVar40,bezier_basis0._5100_32_,auVar37);
  auVar29 = vsubps_avx(auVar62,auVar21);
  auVar32 = vsubps_avx(auVar29,(undefined1  [16])aVar1);
  auVar33 = vmulps_avx512vl(auVar14,auVar32);
  auVar32 = vshufps_avx(auVar33,auVar33,0xaa);
  auVar62._0_4_ = fVar83 * auVar32._0_4_;
  auVar62._4_4_ = fVar84 * auVar32._4_4_;
  auVar62._8_4_ = fVar85 * auVar32._8_4_;
  auVar62._12_4_ = fVar86 * auVar32._12_4_;
  auVar32 = vshufps_avx512vl(auVar33,auVar33,0x55);
  auVar32 = vfmadd231ps_avx512vl(auVar62,(undefined1  [16])aVar2,auVar32);
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  auVar33 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar33);
  auVar32 = vsubps_avx(auVar64,auVar24);
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar32 = vmulps_avx512vl(auVar32,auVar27);
  auVar64._0_4_ = auVar29._0_4_ + auVar32._0_4_;
  auVar64._4_4_ = auVar29._4_4_ + auVar32._4_4_;
  auVar64._8_4_ = auVar29._8_4_ + auVar32._8_4_;
  auVar64._12_4_ = auVar29._12_4_ + auVar32._12_4_;
  auVar32 = vsubps_avx(auVar64,(undefined1  [16])aVar1);
  auVar29 = vmulps_avx512vl(auVar14,auVar32);
  auVar32 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar70._0_4_ = fVar83 * auVar32._0_4_;
  auVar70._4_4_ = fVar84 * auVar32._4_4_;
  auVar70._8_4_ = fVar85 * auVar32._8_4_;
  auVar70._12_4_ = fVar86 * auVar32._12_4_;
  auVar32 = vshufps_avx(auVar29,auVar29,0x55);
  auVar32 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar32);
  auVar21._0_4_ = auVar29._0_4_;
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  auVar29 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar21);
  auVar16 = vsubps_avx512vl(auVar18,auVar16);
  auVar32 = vsubps_avx512vl(auVar26,auVar28);
  auVar32 = vmulps_avx512vl(auVar32,auVar27);
  auVar32 = vsubps_avx(auVar16,auVar32);
  auVar32 = vsubps_avx(auVar32,(undefined1  [16])aVar1);
  auVar28 = vmulps_avx512vl(auVar14,auVar32);
  auVar32 = vshufps_avx(auVar28,auVar28,0xaa);
  auVar88._0_4_ = auVar32._0_4_ * fVar83;
  auVar88._4_4_ = auVar32._4_4_ * fVar84;
  auVar88._8_4_ = auVar32._8_4_ * fVar85;
  auVar88._12_4_ = auVar32._12_4_ * fVar86;
  auVar32 = vshufps_avx512vl(auVar28,auVar28,0x55);
  auVar32 = vfmadd231ps_avx512vl(auVar88,(undefined1  [16])aVar2,auVar32);
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  auVar28 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar28);
  auVar32 = vsubps_avx(auVar16,(undefined1  [16])aVar1);
  auVar74._8_4_ = 2;
  auVar74._0_8_ = 0x200000002;
  auVar74._12_4_ = 2;
  auVar74._16_4_ = 2;
  auVar74._20_4_ = 2;
  auVar74._24_4_ = 2;
  auVar74._28_4_ = 2;
  auVar40 = vpermps_avx2(auVar74,ZEXT1632(auVar28));
  auVar16 = vmulps_avx512vl(auVar14,auVar32);
  auVar32 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar14._0_4_ = fVar83 * auVar32._0_4_;
  auVar14._4_4_ = fVar84 * auVar32._4_4_;
  auVar14._8_4_ = fVar85 * auVar32._8_4_;
  auVar14._12_4_ = fVar86 * auVar32._12_4_;
  uVar58 = auVar16._0_4_;
  auVar22._4_4_ = uVar58;
  auVar22._0_4_ = uVar58;
  auVar22._8_4_ = uVar58;
  auVar22._12_4_ = uVar58;
  auVar32 = vshufps_avx(auVar16,auVar16,0x55);
  auVar32 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar32);
  auVar32 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar22);
  auVar37 = vpermps_avx2(auVar74,ZEXT1632(auVar32));
  auVar51._0_4_ = fVar57 * auVar37._0_4_;
  auVar51._4_4_ = fVar77 * auVar37._4_4_;
  auVar51._8_4_ = fVar78 * auVar37._8_4_;
  auVar51._12_4_ = fVar79 * auVar37._12_4_;
  auVar51._16_4_ = fVar80 * auVar37._16_4_;
  auVar51._20_4_ = fVar81 * auVar37._20_4_;
  auVar51._24_4_ = fVar82 * auVar37._24_4_;
  auVar51._28_4_ = 0;
  auVar47 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar40);
  auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._8568_32_);
  auVar48 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar40);
  auVar40 = vpermps_avx512vl(auVar42,ZEXT1632(auVar28));
  auVar37 = vpermps_avx512vl(auVar42,ZEXT1632(auVar32));
  auVar35 = vmulps_avx512vl(auVar37,bezier_basis0._3944_32_);
  auVar49 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar40);
  auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._8568_32_);
  auVar50 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar40);
  uVar58 = auVar28._0_4_;
  auVar54._4_4_ = uVar58;
  auVar54._0_4_ = uVar58;
  auVar54._8_4_ = uVar58;
  auVar54._12_4_ = uVar58;
  auVar54._16_4_ = uVar58;
  auVar54._20_4_ = uVar58;
  auVar54._24_4_ = uVar58;
  auVar54._28_4_ = uVar58;
  auVar52._0_4_ = auVar32._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  auVar52._16_4_ = auVar52._0_4_;
  auVar52._20_4_ = auVar52._0_4_;
  auVar52._24_4_ = auVar52._0_4_;
  auVar52._28_4_ = auVar52._0_4_;
  auVar40._4_4_ = fVar77 * auVar52._0_4_;
  auVar40._0_4_ = fVar57 * auVar52._0_4_;
  auVar40._8_4_ = fVar78 * auVar52._0_4_;
  auVar40._12_4_ = fVar79 * auVar52._0_4_;
  auVar40._16_4_ = fVar80 * auVar52._0_4_;
  auVar40._20_4_ = fVar81 * auVar52._0_4_;
  auVar40._24_4_ = fVar82 * auVar52._0_4_;
  auVar40._28_4_ = bezier_basis0._3972_4_;
  auVar51 = vfmadd231ps_avx512vl(auVar40,auVar54,bezier_basis0._2788_32_);
  auVar40 = vmulps_avx512vl(auVar52,bezier_basis0._8568_32_);
  auVar37 = vmaxps_avx(auVar67,auVar46);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar53 = vmulps_avx512vl(ZEXT1632(auVar63),auVar52);
  auVar54 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._7412_32_,auVar54);
  auVar40 = vblendps_avx(auVar53,ZEXT832(0) << 0x20,1);
  auVar35 = vsubps_avx(auVar46,auVar40);
  auVar40 = vblendps_avx(auVar53,ZEXT832(0) << 0x20,0x80);
  auVar89._0_4_ = auVar46._0_4_ + auVar40._0_4_;
  auVar89._4_4_ = auVar46._4_4_ + auVar40._4_4_;
  auVar89._8_4_ = auVar46._8_4_ + auVar40._8_4_;
  auVar89._12_4_ = auVar46._12_4_ + auVar40._12_4_;
  auVar89._16_4_ = auVar46._16_4_ + auVar40._16_4_;
  auVar89._20_4_ = auVar46._20_4_ + auVar40._20_4_;
  auVar89._24_4_ = auVar46._24_4_ + auVar40._24_4_;
  auVar89._28_4_ = auVar46._28_4_ + auVar40._28_4_;
  auVar40 = vmaxps_avx(auVar35,auVar89);
  auVar55 = vmaxps_avx512vl(auVar37,auVar40);
  auVar40 = vminps_avx(auVar34,auVar39);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar37 = vminps_avx512vl(auVar56,auVar36);
  auVar53 = vminps_avx(auVar37,auVar40);
  auVar40 = vminps_avx512vl(auVar44,auVar45);
  auVar37 = vminps_avx512vl(auVar56,auVar43);
  auVar44 = vminps_avx512vl(auVar37,auVar40);
  auVar40 = vminps_avx(auVar35,auVar89);
  auVar37 = vminps_avx512vl(auVar56,auVar46);
  auVar34 = vminps_avx(auVar37,auVar40);
  auVar40 = vpermps_avx2(auVar74,ZEXT1632(auVar29));
  auVar37._8_8_ = bezier_basis0._1640_8_;
  auVar37._0_8_ = bezier_basis0._1632_8_;
  auVar37._16_8_ = bezier_basis0._1648_8_;
  auVar37._24_8_ = bezier_basis0._1656_8_;
  auVar32 = vfmadd231ps_fma(auVar47,auVar37,auVar40);
  auVar35 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._6256_32_,auVar40);
  auVar40 = vpermps_avx2(auVar74,ZEXT1632(auVar33));
  auVar39._8_8_ = bezier_basis0._484_8_;
  auVar39._0_8_ = bezier_basis0._476_8_;
  auVar39._16_8_ = bezier_basis0._492_8_;
  auVar39._24_8_ = bezier_basis0._500_8_;
  auVar43 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar39,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._5100_32_,auVar40);
  auVar35 = vpermps_avx512vl(auVar42,ZEXT1632(auVar29));
  auVar32 = vfmadd231ps_fma(auVar49,auVar37,auVar35);
  auVar35 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._6256_32_,auVar35);
  auVar71._0_4_ = auVar29._0_4_;
  auVar71._4_4_ = auVar71._0_4_;
  auVar71._8_4_ = auVar71._0_4_;
  auVar71._12_4_ = auVar71._0_4_;
  auVar71._16_4_ = auVar71._0_4_;
  auVar71._20_4_ = auVar71._0_4_;
  auVar71._24_4_ = auVar71._0_4_;
  auVar71._28_4_ = auVar71._0_4_;
  auVar29 = vfmadd231ps_fma(auVar51,auVar71,auVar37);
  auVar37 = vmaxps_avx512vl(auVar67,auVar43);
  auVar45 = vmulps_avx512vl(auVar40,auVar52);
  auVar46 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._6256_32_,auVar71);
  auVar47 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar40 = vblendps_avx(auVar45,auVar47,1);
  auVar36 = vsubps_avx(auVar43,auVar40);
  auVar40 = vblendps_avx(auVar45,auVar47,0x80);
  auVar72._0_4_ = auVar40._0_4_ + auVar43._0_4_;
  auVar72._4_4_ = auVar40._4_4_ + auVar43._4_4_;
  auVar72._8_4_ = auVar40._8_4_ + auVar43._8_4_;
  auVar72._12_4_ = auVar40._12_4_ + auVar43._12_4_;
  auVar72._16_4_ = auVar40._16_4_ + auVar43._16_4_;
  auVar72._20_4_ = auVar40._20_4_ + auVar43._20_4_;
  auVar72._24_4_ = auVar40._24_4_ + auVar43._24_4_;
  auVar72._28_4_ = auVar40._28_4_ + auVar43._28_4_;
  auVar40 = vmaxps_avx(auVar36,auVar72);
  auVar37 = vmaxps_avx(auVar37,auVar40);
  auVar40 = vpermps_avx512vl(auVar42,ZEXT1632(auVar33));
  auVar45 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar39,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._5100_32_,auVar40);
  auVar49._0_4_ = auVar33._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar49._16_4_ = auVar49._0_4_;
  auVar49._20_4_ = auVar49._0_4_;
  auVar49._24_4_ = auVar49._0_4_;
  auVar49._28_4_ = auVar49._0_4_;
  auVar47 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar49,auVar39);
  auVar35 = vmaxps_avx512vl(auVar67,auVar45);
  auVar42 = vmulps_avx512vl(auVar40,auVar52);
  auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._5100_32_,auVar49);
  auVar49 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar40 = vblendps_avx(auVar42,auVar49,1);
  auVar39 = vsubps_avx(auVar45,auVar40);
  auVar40 = vblendps_avx(auVar42,auVar49,0x80);
  auVar75._0_4_ = auVar40._0_4_ + auVar45._0_4_;
  auVar75._4_4_ = auVar40._4_4_ + auVar45._4_4_;
  auVar75._8_4_ = auVar40._8_4_ + auVar45._8_4_;
  auVar75._12_4_ = auVar40._12_4_ + auVar45._12_4_;
  auVar75._16_4_ = auVar40._16_4_ + auVar45._16_4_;
  auVar75._20_4_ = auVar40._20_4_ + auVar45._20_4_;
  auVar75._24_4_ = auVar40._24_4_ + auVar45._24_4_;
  auVar75._28_4_ = auVar40._28_4_ + auVar45._28_4_;
  auVar40 = vmaxps_avx(auVar39,auVar75);
  auVar35 = vmaxps_avx(auVar35,auVar40);
  auVar48 = vmaxps_avx512vl(auVar67,auVar47);
  auVar46 = vmulps_avx512vl(auVar46,auVar52);
  auVar40 = vblendps_avx(auVar46,auVar49,1);
  auVar42 = vsubps_avx(auVar47,auVar40);
  auVar40 = vblendps_avx(auVar46,auVar49,0x80);
  auVar68._0_4_ = auVar47._0_4_ + auVar40._0_4_;
  auVar68._4_4_ = auVar47._4_4_ + auVar40._4_4_;
  auVar68._8_4_ = auVar47._8_4_ + auVar40._8_4_;
  auVar68._12_4_ = auVar47._12_4_ + auVar40._12_4_;
  auVar68._16_4_ = auVar47._16_4_ + auVar40._16_4_;
  auVar68._20_4_ = auVar47._20_4_ + auVar40._20_4_;
  auVar68._24_4_ = auVar47._24_4_ + auVar40._24_4_;
  auVar68._28_4_ = auVar47._28_4_ + auVar40._28_4_;
  auVar40 = vmaxps_avx(auVar42,auVar68);
  auVar40 = vmaxps_avx(auVar48,auVar40);
  auVar36 = vminps_avx(auVar36,auVar72);
  auVar43 = vminps_avx512vl(auVar56,auVar43);
  auVar36 = vminps_avx(auVar43,auVar36);
  auVar39 = vminps_avx(auVar39,auVar75);
  auVar43 = vminps_avx512vl(auVar56,auVar45);
  auVar39 = vminps_avx(auVar43,auVar39);
  auVar43 = vminps_avx512vl(auVar56,auVar47);
  auVar42 = vminps_avx(auVar42,auVar68);
  auVar42 = vminps_avx(auVar43,auVar42);
  auVar43 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar40,auVar43);
  auVar43 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vmaxps_avx(auVar40,auVar43);
  auVar32 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar40 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar40 = vmaxps_avx(auVar35,auVar40);
  auVar35 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vmaxps_avx(auVar40,auVar35);
  auVar29 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar29 = vunpcklps_avx(auVar32,auVar29);
  auVar40 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar40 = vmaxps_avx(auVar37,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vmaxps_avx(auVar40,auVar37);
  auVar32 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar32 = vinsertps_avx(auVar29,auVar32,0x28);
  auVar40 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar40 = vminps_avx(auVar42,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar29 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar40 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar40 = vminps_avx(auVar39,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar33 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar33 = vunpcklps_avx(auVar29,auVar33);
  auVar40 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar40 = vminps_avx(auVar36,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar29 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar29 = vinsertps_avx(auVar33,auVar29,0x28);
  auVar40 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar40 = vminps_avx(auVar34,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar33 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar40 = vminps_avx(auVar44,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar28 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar28 = vunpcklps_avx(auVar33,auVar28);
  auVar40 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar40 = vminps_avx(auVar53,auVar40);
  auVar37 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar37);
  auVar33 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar33 = vinsertps_avx(auVar28,auVar33,0x28);
  auVar28 = vminps_avx(auVar29,auVar33);
  auVar40 = vshufps_avx512vl(auVar55,auVar55,0xb1);
  auVar37 = vmaxps_avx512vl(auVar55,auVar40);
  auVar40 = vshufpd_avx(auVar37,auVar37,5);
  auVar40 = vmaxps_avx(auVar37,auVar40);
  auVar29 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar40 = vshufps_avx(auVar38,auVar38,0xb1);
  auVar40 = vmaxps_avx(auVar38,auVar40);
  auVar38 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vmaxps_avx(auVar40,auVar38);
  auVar33 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar33 = vunpcklps_avx(auVar29,auVar33);
  auVar40 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar40 = vmaxps_avx(auVar41,auVar40);
  auVar38 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vmaxps_avx(auVar40,auVar38);
  auVar29 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar29 = vinsertps_avx(auVar33,auVar29,0x28);
  auVar33 = vmaxps_avx(auVar32,auVar29);
  auVar63._8_4_ = 0x7fffffff;
  auVar63._0_8_ = 0x7fffffff7fffffff;
  auVar63._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx(auVar28,auVar63);
  auVar29 = vandps_avx(auVar33,auVar63);
  auVar32 = vmaxps_avx(auVar32,auVar29);
  auVar29 = vmovshdup_avx(auVar32);
  auVar29 = vmaxss_avx(auVar29,auVar32);
  auVar32 = vshufpd_avx(auVar32,auVar32,1);
  auVar32 = vmaxss_avx(auVar32,auVar29);
  fVar57 = auVar32._0_4_ * 4.7683716e-07;
  auVar26._4_4_ = fVar57;
  auVar26._0_4_ = fVar57;
  auVar26._8_4_ = fVar57;
  auVar26._12_4_ = fVar57;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar28,auVar26);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar33._0_4_ + fVar57;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar33._4_4_ + fVar57;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar33._8_4_ + fVar57;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar33._12_4_ + fVar57;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }